

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void write_config_options(FILE_conflict *fp,nh_option_desc *options)

{
  undefined8 uVar1;
  char *__format;
  
  for (; options->name != (char *)0x0; options = options + 1) {
    uVar1 = nh_get_option_string(options);
    __format = "%s=%s\n";
    if ((options->type & ~OPTTYPE_INT) == OPTTYPE_ENUM) {
      __format = "%s=\"%s\"\n";
    }
    fprintf((FILE *)fp,__format,options->name,uVar1);
  }
  return;
}

Assistant:

static void write_config_options(FILE *fp, struct nh_option_desc *options)
{
    int i;
    const char *optval;
    
    for (i = 0; options[i].name; i++) {
	optval = nh_get_option_string(&options[i]);
	if (options[i].type == OPTTYPE_STRING ||
	    options[i].type == OPTTYPE_ENUM)
	    fprintf(fp, "%s=\"%s\"\n", options[i].name, optval);
	else
	    fprintf(fp, "%s=%s\n", options[i].name, optval);
    }
}